

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

int clone_bbs(gen_ctx_t gen_ctx)

{
  MIR_context_t ctx;
  MIR_func_t func;
  bb_insn_t pbVar1;
  out_edge_t peVar2;
  VARR_bb_t *varr;
  edge_t_conflict e;
  bb_t pbVar3;
  MIR_context_t ctx_00;
  MIR_item_t pMVar4;
  MIR_label_t label;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  bb_t_conflict pbVar8;
  MIR_insn_t_conflict pMVar9;
  MIR_insn_t_conflict insn;
  bb_t_conflict bb;
  void *pvVar10;
  DLIST_bb_insn_t *pDVar11;
  MIR_insn_t pMVar12;
  DLIST_bb_insn_t *pDVar13;
  MIR_insn_t insn_00;
  MIR_insn_t after;
  ulong uVar14;
  DLIST_bb_t *pDVar15;
  ulong local_b0;
  ulong local_a8;
  
  if (gen_ctx->optimize_level == 0) {
    __assert_fail("gen_ctx->optimize_level != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x7d3,"int clone_bbs(gen_ctx_t)");
  }
  ctx = gen_ctx->ctx;
  func = (gen_ctx->curr_func_item->u).func;
  bitmap_clear(gen_ctx->temp_bitmap);
  pDVar15 = &gen_ctx->curr_cfg->bbs;
  while( true ) {
    pbVar8 = pDVar15->head;
    if (pbVar8 == (bb_t_conflict)0x0) goto LAB_0012e1d7;
    sVar7 = pbVar8->index;
    bitmap_set_bit_p(gen_ctx->temp_bitmap,sVar7);
    pbVar1 = (pbVar8->bb_insns).tail;
    if ((pbVar1 != (bb_insn_t)0x0) && (*(int *)&pbVar1->insn->field_0x18 - 0xabU < 2)) break;
    pDVar15 = (DLIST_bb_t *)&(pbVar8->bb_link).next;
  }
  VARR_bb_ttrunc(gen_ctx->data_flow_ctx->worklist,sVar7);
  while (pbVar8 = (pbVar8->bb_link).next, pbVar8 != (bb_t_conflict)0x0) {
    pbVar1 = (pbVar8->bb_insns).tail;
    if (pbVar1 == (bb_insn_t)0x0) {
      __assert_fail("bb_insn != ((void*)0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x7de,"int clone_bbs(gen_ctx_t)");
    }
    if (((*(int *)&pbVar1->insn->field_0x18 == 0x76) &&
        (peVar2 = (pbVar8->out_edges).head, peVar2 != (out_edge_t)0x0)) &&
       (iVar6 = bitmap_bit_p(gen_ctx->temp_bitmap,peVar2->dst->index), iVar6 != 0)) {
      VARR_bb_tpush(gen_ctx->data_flow_ctx->worklist,pbVar8);
    }
  }
  local_a8 = VARR_bb_tlength(gen_ctx->data_flow_ctx->worklist);
  bVar5 = true;
  uVar14 = 0;
  iVar6 = 0;
  local_b0 = 0;
  while (sVar7 = VARR_bb_tlength(gen_ctx->data_flow_ctx->worklist), sVar7 != 0) {
    varr = gen_ctx->data_flow_ctx->worklist;
    if (sVar7 < local_a8) {
      if (((varr == (VARR_bb_t *)0x0) || (varr->varr == (bb_t_conflict *)0x0)) ||
         (varr->els_num == 0)) {
        mir_varr_assert_fail("last","bb_t");
      }
      uVar14 = 0;
      for (pDVar11 = &varr->varr[varr->els_num - 1]->bb_insns; local_b0 = uVar14, local_a8 = sVar7,
          pDVar11->head != (bb_insn_t)0x0;
          pDVar11 = (DLIST_bb_insn_t *)&(pDVar11->head->bb_insn_link).next) {
        uVar14 = uVar14 + 1;
      }
    }
    pbVar8 = VARR_bb_tpop(varr);
    e = (pbVar8->out_edges).head;
    if ((e->out_link).next != (out_edge_t)0x0) {
      __assert_fail("(DLIST_out_edge_t_next (e)) == ((void*)0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x7ed,"int clone_bbs(gen_ctx_t)");
    }
    if (e->back_edge_p == '\0') {
      pbVar1 = (pbVar8->bb_insns).tail;
      if ((pbVar1 == (bb_insn_t)0x0) ||
         (insn_00 = pbVar1->insn, *(int *)&insn_00->field_0x18 != 0x76)) {
        __assert_fail("bb_insn != ((void*)0) && bb_insn->insn->code == MIR_JMP",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x7f0,"int clone_bbs(gen_ctx_t)");
      }
      pbVar3 = e->dst;
      pMVar12 = ((pbVar3->bb_insns).tail)->insn;
      if ((2 < *(int *)&pMVar12->field_0x18 - 0xaaU) && (uVar14 <= local_b0 * 3)) {
        if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
          fprintf((FILE *)gen_ctx->debug_file,"  Cloning from BB%lu into BB%lu:\n",pbVar3->index,
                  pbVar8->index);
          insn_00 = pbVar1->insn;
          pMVar12 = ((pbVar3->bb_insns).tail)->insn;
        }
        after = (insn_00->insn_link).prev;
        pDVar11 = &pbVar8->bb_insns;
        gen_delete_insn(gen_ctx,insn_00);
        pDVar13 = &pbVar3->bb_insns;
        while (pbVar1 = pDVar13->head, pbVar1 != (bb_insn_t)0x0) {
          pMVar9 = after;
          if (*(int *)&pbVar1->insn->field_0x18 != 0xb4) {
            pMVar9 = MIR_copy_insn(ctx,pbVar1->insn);
            MIR_insert_insn_after(ctx,gen_ctx->curr_func_item,after,pMVar9);
            add_new_bb_insn(gen_ctx,pMVar9,pbVar8,1);
            if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
              fprintf((FILE *)gen_ctx->debug_file,"  Adding insn %-5lu",
                      (ulong)*(uint *)((long)pMVar9->data + 0xc));
              MIR_output_insn(ctx,gen_ctx->debug_file,pMVar9,func,1);
            }
            uVar14 = uVar14 + 1;
          }
          after = pMVar9;
          pDVar13 = (DLIST_bb_insn_t *)&(pbVar1->bb_insn_link).next;
        }
        delete_edge(e);
        if (pMVar12 == (MIR_insn_t)0x0) {
          __assert_fail("last_dst_insn != ((void*)0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x810,"int clone_bbs(gen_ctx_t)");
        }
        if (*(int *)&pMVar12->field_0x18 - 0x77U < 0x2e) {
          pMVar9 = (pMVar12->insn_link).next;
          insn = pMVar9;
          if (*(int *)&pMVar9->field_0x18 != 0xb4) {
            ctx_00 = gen_ctx->ctx;
            insn = MIR_new_label(ctx_00);
            MIR_insert_insn_before(ctx_00,gen_ctx->curr_func_item,pMVar9,insn);
            add_new_bb_insn(gen_ctx,insn,*(bb_t_conflict *)((long)pMVar9->data + 0x30),0);
          }
          MIR_new_label_op(ctx,insn);
          pMVar9 = MIR_new_insn(ctx,MIR_JMP);
          MIR_insert_insn_after(ctx,gen_ctx->curr_func_item,after,pMVar9);
          bb = create_bb(gen_ctx,pMVar9);
          insert_new_bb_after(gen_ctx,pbVar8,bb);
          iVar6 = bitmap_bit_p(gen_ctx->temp_bitmap,**(size_t **)((long)insn->data + 0x30));
          if (iVar6 != 0) {
            VARR_bb_tpush(gen_ctx->data_flow_ctx->worklist,bb);
          }
          create_edge(gen_ctx,pbVar8,bb,1,1);
          create_edge(gen_ctx,pbVar8,*(bb_t_conflict *)((long)(pMVar12->ops[0].u.ref)->data + 0x30),
                      0,1);
          pvVar10 = insn->data;
LAB_0012e008:
          create_edge(gen_ctx,bb,*(bb_t_conflict *)((long)pvVar10 + 0x30),0,1);
        }
        else {
          if (*(int *)&pMVar12->field_0x18 != 0x76) {
            label = (pMVar12->insn_link).next;
            if (*(int *)&label->field_0x18 != 0xb4) {
              __assert_fail("next_insn->code == MIR_LABEL",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                            ,0x819,"int clone_bbs(gen_ctx_t)");
            }
            pvVar10 = label->data;
            MIR_new_label_op(ctx,label);
            pMVar9 = MIR_new_insn(ctx,MIR_JMP);
            MIR_insert_insn_after(ctx,gen_ctx->curr_func_item,after,pMVar9);
            add_new_bb_insn(gen_ctx,pMVar9,pbVar8,1);
            iVar6 = bitmap_bit_p(gen_ctx->temp_bitmap,(ulong)*(uint *)((long)pvVar10 + 0xc));
            if (iVar6 != 0) {
              VARR_bb_tpush(gen_ctx->data_flow_ctx->worklist,pbVar8);
            }
            pvVar10 = label->data;
            bb = pbVar8;
            goto LAB_0012e008;
          }
          pMVar4 = pMVar12->ops[0].u.ref;
          create_edge(gen_ctx,pbVar8,*(bb_t_conflict *)((long)pMVar4->data + 0x30),0,1);
          iVar6 = bitmap_bit_p(gen_ctx->temp_bitmap,(ulong)*(uint *)((long)pMVar4->data + 0xc));
          if (iVar6 != 0) {
            VARR_bb_tpush(gen_ctx->data_flow_ctx->worklist,pbVar8);
          }
        }
        bVar5 = false;
        iVar6 = 1;
        if ((FILE *)gen_ctx->debug_file != (FILE *)0x0) {
          bVar5 = false;
          iVar6 = 1;
          if (1 < gen_ctx->debug_level) {
            fprintf((FILE *)gen_ctx->debug_file,"  Result BB%lu:\n",pbVar8->index);
            output_in_edges(gen_ctx,pbVar8);
            output_out_edges(gen_ctx,pbVar8);
            while (pbVar1 = pDVar11->head, pbVar1 != (bb_insn_t)0x0) {
              fprintf((FILE *)gen_ctx->debug_file,"  %-5lu",(ulong)pbVar1->index);
              MIR_output_insn(ctx,gen_ctx->debug_file,pbVar1->insn,func,1);
              pDVar11 = (DLIST_bb_insn_t *)&(pbVar1->bb_insn_link).next;
            }
            bVar5 = false;
            iVar6 = 1;
          }
        }
      }
    }
  }
  if (bVar5) {
LAB_0012e1d7:
    iVar6 = 0;
  }
  else {
    remove_unreachable_bbs(gen_ctx);
    enumerate_bbs(gen_ctx);
  }
  return iVar6;
}

Assistant:

static int clone_bbs (gen_ctx_t gen_ctx) {
  const int max_bb_growth_factor = 3;
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_insn_t dst_insn, last_dst_insn, new_insn, label, next_insn, after;
  bb_t bb, dst, new_bb;
  edge_t e;
  bb_insn_t bb_insn, dst_bb_insn, next_bb_insn;
  MIR_func_t func = curr_func_item->u.func;
  size_t size, orig_size, len, last_orig_bound;
  int res;

  gen_assert (optimize_level != 0);
  bitmap_clear (temp_bitmap);
  for (bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb)) {
    bitmap_set_bit_p (temp_bitmap, bb->index);
    if ((bb_insn = DLIST_TAIL (bb_insn_t, bb->bb_insns)) == NULL) continue;
    if (bb_insn->insn->code == MIR_RET || bb_insn->insn->code == MIR_JRET) break;
  }
  if (bb == NULL) return FALSE;
  VARR_TRUNC (bb_t, worklist, 0);
  for (bb = DLIST_NEXT (bb_t, bb); bb != NULL; bb = DLIST_NEXT (bb_t, bb)) {
    bb_insn = DLIST_TAIL (bb_insn_t, bb->bb_insns);
    gen_assert (bb_insn != NULL);
    if (bb_insn->insn->code == MIR_JMP && (e = DLIST_HEAD (out_edge_t, bb->out_edges)) != NULL
        && bitmap_bit_p (temp_bitmap, e->dst->index))
      VARR_PUSH (bb_t, worklist, bb);
  }
  res = FALSE;
  last_orig_bound = VARR_LENGTH (bb_t, worklist);
  orig_size = size = 0;
  while ((len = VARR_LENGTH (bb_t, worklist)) != 0) {
    if (last_orig_bound > len) {
      last_orig_bound = len;
      orig_size = size = DLIST_LENGTH (bb_insn_t, VARR_LAST (bb_t, worklist)->bb_insns);
    }
    bb = VARR_POP (bb_t, worklist);
    e = DLIST_HEAD (out_edge_t, bb->out_edges);
    gen_assert (DLIST_NEXT (out_edge_t, e) == NULL);
    if (e->back_edge_p) continue;
    bb_insn = DLIST_TAIL (bb_insn_t, bb->bb_insns);
    gen_assert (bb_insn != NULL && bb_insn->insn->code == MIR_JMP);
    dst = e->dst;
    dst_bb_insn = DLIST_TAIL (bb_insn_t, dst->bb_insns);
    if (dst_bb_insn->insn->code == MIR_RET || dst_bb_insn->insn->code == MIR_JRET
        || dst_bb_insn->insn->code == MIR_SWITCH || size > max_bb_growth_factor * orig_size)
      continue;
    res = TRUE;
    DEBUG (2, {
      fprintf (debug_file, "  Cloning from BB%lu into BB%lu:\n", (unsigned long) dst->index,
               (unsigned long) bb->index);
    });
    last_dst_insn = DLIST_TAIL (bb_insn_t, dst->bb_insns)->insn;
    after = DLIST_PREV (MIR_insn_t, bb_insn->insn);
    gen_delete_insn (gen_ctx, bb_insn->insn);
    bb_insn = NULL;
    for (dst_bb_insn = DLIST_HEAD (bb_insn_t, dst->bb_insns); dst_bb_insn != NULL;
         dst_bb_insn = DLIST_NEXT (bb_insn_t, dst_bb_insn)) {
      dst_insn = dst_bb_insn->insn;
      if (dst_insn->code == MIR_LABEL) continue;
      new_insn = MIR_copy_insn (ctx, dst_insn);
      /* we can not use gen_add_insn_xxx becuase of some cases (e.g. bb_insn is the last insn): */
      MIR_insert_insn_after (ctx, curr_func_item, after, new_insn);
      add_new_bb_insn (gen_ctx, new_insn, bb, TRUE);
      after = new_insn;
      DEBUG (2, {
        fprintf (debug_file, "  Adding insn %-5lu",
                 (unsigned long) ((bb_insn_t) new_insn->data)->index);
        MIR_output_insn (ctx, debug_file, new_insn, func, TRUE);
      });
      size++;
    }
    delete_edge (e);
    gen_assert (last_dst_insn != NULL);
    if (last_dst_insn->code == MIR_JMP) {
      label = last_dst_insn->ops[0].u.label;
      create_edge (gen_ctx, bb, ((bb_insn_t) label->data)->bb, FALSE, TRUE);
      if (bitmap_bit_p (temp_bitmap, ((bb_insn_t) label->data)->index))
        VARR_PUSH (bb_t, worklist, bb);
    } else if (!MIR_branch_code_p (last_dst_insn->code)) {
      next_insn = DLIST_NEXT (MIR_insn_t, last_dst_insn);
      next_bb_insn = next_insn->data;
      gen_assert (next_insn->code == MIR_LABEL);
      new_insn = MIR_new_insn (ctx, MIR_JMP, MIR_new_label_op (ctx, next_insn));
      MIR_insert_insn_after (ctx, curr_func_item, after, new_insn);
      add_new_bb_insn (gen_ctx, new_insn, bb, TRUE);
      if (bitmap_bit_p (temp_bitmap, next_bb_insn->index)) VARR_PUSH (bb_t, worklist, bb);
      create_edge (gen_ctx, bb, ((bb_insn_t) next_insn->data)->bb, FALSE, TRUE);
    } else {
      label = get_insn_label (gen_ctx, DLIST_NEXT (MIR_insn_t, last_dst_insn)); /* fallthrough */
      new_insn = MIR_new_insn (ctx, MIR_JMP, MIR_new_label_op (ctx, label));
      MIR_insert_insn_after (ctx, curr_func_item, after, new_insn);
      new_bb = create_bb (gen_ctx, new_insn);
      insert_new_bb_after (gen_ctx, bb, new_bb);
      if (bitmap_bit_p (temp_bitmap, ((bb_insn_t) label->data)->bb->index))
        VARR_PUSH (bb_t, worklist, new_bb);
      create_edge (gen_ctx, bb, new_bb, TRUE, TRUE); /* fall through */
      create_edge (gen_ctx, bb, ((bb_insn_t) last_dst_insn->ops[0].u.label->data)->bb, FALSE,
                   TRUE); /* branch */
      create_edge (gen_ctx, new_bb, ((bb_insn_t) label->data)->bb, FALSE, TRUE);
    }
    DEBUG (2, {
      fprintf (debug_file, "  Result BB%lu:\n", (unsigned long) bb->index);
      output_in_edges (gen_ctx, bb);
      output_out_edges (gen_ctx, bb);
      for (bb_insn = DLIST_HEAD (bb_insn_t, bb->bb_insns); bb_insn != NULL;
           bb_insn = DLIST_NEXT (bb_insn_t, bb_insn)) {
        fprintf (debug_file, "  %-5lu", (unsigned long) bb_insn->index);
        MIR_output_insn (ctx, debug_file, bb_insn->insn, func, TRUE);
      }
    });
  }
  if (res) {
    remove_unreachable_bbs (gen_ctx);
    enumerate_bbs (gen_ctx);
  }
  return res;
}